

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessTextureDeclaration
          (ConversionStream *this,iterator *Token,
          vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
          *Samplers,ObjectsTypeHashType *Objects,char *SamplerSuffix,Uint32 *ImageBinding)

{
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> *this_00;
  uint uVar1;
  undefined4 _Type;
  bool bVar2;
  bool bVar3;
  pointer pHVar4;
  long lVar5;
  ostream *poVar6;
  Char *pCVar7;
  size_type sVar8;
  pointer puVar9;
  pointer pvVar10;
  pointer pHVar11;
  ObjectsTypeHashType *End;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  __enable_if_t<is_constructible<value_type,_pair<HashMapStringKey,_HLSLObjectInfo>_&&>::value,_pair<iterator,_bool>_>
  _Var12;
  bool local_a71;
  bool local_921;
  _Self local_920;
  int local_918;
  allocator local_911;
  string local_910;
  allocator local_8e9;
  string local_8e8;
  HLSLTokenInfo local_8c8;
  const_iterator local_878;
  _List_node_base *local_870;
  _Self local_868;
  _List_node_base *local_860;
  const_iterator local_858;
  iterator local_850;
  iterator CurrToken;
  _Self local_840;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>,_false>
  local_838;
  undefined1 local_830;
  HLSLObjectInfo local_828;
  HashMapStringKey local_800;
  pair<Diligent::HashMapStringKey,_Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo> local_7f0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
  local_7b8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
  local_7b0;
  const_iterator SamplerIt;
  undefined1 local_7a0 [8];
  const_reverse_iterator ScopeIt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> SamplerName;
  String CompleteGLSLSampler;
  undefined1 local_738 [8];
  string err_13;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_708;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_700;
  _List_node_base *local_6f8;
  _Self local_6f0;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_6e8;
  iterator TmpToken;
  Uint32 ArrayDim;
  String *TextureName;
  undefined1 local_6b0 [8];
  string err_12;
  bool IsGlobalScope;
  const_iterator local_680;
  const_iterator local_678;
  undefined1 local_670 [8];
  string msg_2;
  undefined1 local_630 [8];
  string err_11;
  string local_608 [32];
  stringstream local_5e8 [8];
  stringstream ss;
  ostream local_5d8 [376];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_460;
  undefined8 local_458;
  string local_450;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_430;
  undefined8 local_428;
  string local_420;
  undefined1 local_400 [8];
  string msg_1;
  undefined1 local_3c0 [8];
  string err_10;
  undefined1 local_380 [8];
  string err_9;
  String local_358;
  undefined1 local_338 [8];
  string err_8;
  undefined1 local_2f8 [8];
  string err_7;
  String local_2d0;
  undefined1 local_2b0 [8];
  string err_6;
  String local_288;
  undefined1 local_268 [8];
  string err_5;
  undefined1 local_228 [8];
  string err_4;
  undefined1 local_1e8 [8];
  string err_3;
  iterator TexFmtToken;
  undefined1 local_1a0 [8];
  string err_2;
  String local_178;
  undefined1 local_158 [8];
  string err_1;
  undefined1 local_130 [8];
  string msg;
  string local_108 [4];
  Uint32 NumComponents;
  String LayoutQualifier;
  String GLSLSampler;
  iterator TypeDefinitionStart;
  undefined1 local_90 [8];
  string err;
  undefined1 local_68 [8];
  String ImgFormat;
  bool IsRWTexture;
  iterator iStack_40;
  TokenType TextureDim;
  iterator TexDeclToken;
  Uint32 *ImageBinding_local;
  char *SamplerSuffix_local;
  ObjectsTypeHashType *Objects_local;
  vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
  *Samplers_local;
  iterator *Token_local;
  ConversionStream *this_local;
  
  iStack_40 = (iterator)Token->_M_node;
  End = Objects;
  Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)SamplerSuffix;
  TexDeclToken._M_node = (_List_node_base *)ImageBinding;
  pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                     (&stack0xffffffffffffffc0);
  ImgFormat.field_2._12_4_ = pHVar4->Type;
  local_921 = true;
  if ((((ImgFormat.field_2._12_4_ != kw_RWTexture1D) &&
       (local_921 = true, ImgFormat.field_2._12_4_ != kw_RWTexture1DArray)) &&
      (local_921 = true, ImgFormat.field_2._12_4_ != kw_RWTexture2D)) &&
     ((local_921 = true, ImgFormat.field_2._12_4_ != kw_RWTexture2DArray &&
      (local_921 = true, ImgFormat.field_2._12_4_ != kw_RWTexture3D)))) {
    local_921 = ImgFormat.field_2._12_4_ == kw_RWBuffer;
  }
  ImgFormat.field_2._M_local_buf[0xb] = local_921;
  std::__cxx11::string::string((string *)local_68);
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
  err.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar2 = std::operator!=(Token,(_Self *)((long)&err.field_2 + 8));
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                       (&stack0xffffffffffffffc0);
    FormatString<char[19],std::__cxx11::string,char[13]>
              ((string *)local_90,(Diligent *)"Unexpected EOF in ",(char (*) [19])&pHVar4->Literal,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x474511,
               (char (*) [13])Args);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)&TypeDefinitionStart,this,Token,4);
    End = (ObjectsTypeHashType *)0x543;
    Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x543,Args,(char (*) [2])0x46b1a3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &TypeDefinitionStart);
    std::__cxx11::string::~string((string *)&TypeDefinitionStart);
    std::__cxx11::string::~string((string *)local_90);
  }
  GLSLSampler.field_2._8_8_ = Token->_M_node;
  std::__cxx11::string::string((string *)(LayoutQualifier.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_108);
  msg.field_2._12_4_ = 0;
  pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  bVar2 = std::operator==(&pHVar4->Literal,"<");
  if (bVar2) {
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    if (pHVar4->Type != ComparisonOp) {
      FormatString<char[26],char[39]>
                ((string *)local_130,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Token->Type == TokenType::ComparisonOp",(char (*) [39])End);
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      End = (ObjectsTypeHashType *)0x54c;
      DebugAssertionFailed
                (pCVar7,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x54c);
      std::__cxx11::string::~string((string *)local_130);
    }
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    pHVar4->Type = OpenAngleBracket;
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
    err_1.field_2._8_8_ =
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         end(&this->m_Tokens);
    bVar2 = std::operator!=(Token,(_Self *)((long)&err_1.field_2 + 8));
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                         (&stack0xffffffffffffffc0);
      FormatString<char[19],std::__cxx11::string,char[13]>
                ((string *)local_158,(Diligent *)"Unexpected EOF in ",
                 (char (*) [19])&pHVar4->Literal,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x474511,
                 (char (*) [13])Args);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_178,this,Token,4);
      End = (ObjectsTypeHashType *)0x550;
      Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x550,Args,(char (*) [2])0x46b1a3,&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)local_158);
    }
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    if (pHVar4->Type == kw_unorm) {
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
      err_2.field_2._8_8_ =
           std::__cxx11::
           list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ::end(&this->m_Tokens);
      bVar2 = std::operator!=(Token,(_Self *)((long)&err_2.field_2 + 8));
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                           (&stack0xffffffffffffffc0);
        FormatString<char[19],std::__cxx11::string,char[13]>
                  ((string *)local_1a0,(Diligent *)"Unexpected EOF in ",
                   (char (*) [19])&pHVar4->Literal,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x474511,
                   (char (*) [13])Args);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  ((String *)&TexFmtToken,this,Token,4);
        End = (ObjectsTypeHashType *)0x557;
        Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessTextureDeclaration",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x557,Args,(char (*) [2])0x46b1a3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&TexFmtToken
                  );
        std::__cxx11::string::~string((string *)&TexFmtToken);
        std::__cxx11::string::~string((string *)local_1a0);
      }
    }
    err_3.field_2._8_8_ = Token->_M_node;
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    bVar2 = Parsing::HLSLTokenInfo::IsBuiltInType(pHVar4);
    if (!bVar2) {
      FormatString<char[42]>
                ((string *)local_1e8,(char (*) [42])"Texture format type must be built-in type");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                ((String *)((long)&err_4.field_2 + 8),this,Token,4);
      End = (ObjectsTypeHashType *)0x55d;
      Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x55d,Args,(char (*) [2])0x46b1a3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&err_4.field_2 + 8));
      std::__cxx11::string::~string((string *)(err_4.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_1e8);
    }
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    if (((int)pHVar4->Type < 0x16) ||
       (pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token),
       0x1a < (int)pHVar4->Type)) {
      pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
      if (((int)pHVar4->Type < 0x2b) ||
         (pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token),
         0x2f < (int)pHVar4->Type)) {
        pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
        if (((int)pHVar4->Type < 0x40) ||
           (pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token),
           0x44 < (int)pHVar4->Type)) {
          pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
          FormatString<std::__cxx11::string,char[137]>
                    ((string *)local_228,(Diligent *)&pHVar4->Literal,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     " is not valid texture component type\nOnly the following texture element types are supported: float[1,2,3,4], int[1,2,3,4], uint[1,2,3,4]"
                     ,(char (*) [137])End);
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    ((String *)((long)&err_5.field_2 + 8),this,Token,4);
          End = (ObjectsTypeHashType *)0x578;
          Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessTextureDeclaration",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x578,Args,(char (*) [2])0x46b1a3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&err_5.field_2 + 8));
          std::__cxx11::string::~string((string *)(err_5.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_228);
        }
        else {
          std::__cxx11::string::push_back((char)&LayoutQualifier + '\x18');
          pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
          if (pHVar4->Type == kw_uint) {
            msg.field_2._12_4_ = 1;
          }
          else {
            pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
            msg.field_2._12_4_ = pHVar4->Type - kw_uint;
          }
        }
      }
      else {
        std::__cxx11::string::push_back((char)&LayoutQualifier + '\x18');
        pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
        if (pHVar4->Type == kw_int) {
          msg.field_2._12_4_ = 1;
        }
        else {
          pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
          msg.field_2._12_4_ = pHVar4->Type - kw_int;
        }
      }
    }
    else {
      pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
      if (pHVar4->Type == kw_float) {
        msg.field_2._12_4_ = 1;
      }
      else {
        pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
        msg.field_2._12_4_ = pHVar4->Type - kw_float;
      }
    }
    if ((msg.field_2._12_4_ == 0) || (4 < (uint)msg.field_2._12_4_)) {
      FormatString<char[38],unsigned_int,char[9]>
                ((string *)local_268,(Diligent *)"Between 1 and 4 components expected, ",
                 (char (*) [38])((long)&msg.field_2 + 0xc),(uint *)" deduced",(char (*) [9])Args);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_288,this,Token,4);
      End = (ObjectsTypeHashType *)0x57a;
      Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x57a,Args,(char (*) [2])0x46b1a3,&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)local_268);
    }
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
    err_6.field_2._8_8_ =
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         end(&this->m_Tokens);
    bVar2 = std::operator!=(Token,(_Self *)((long)&err_6.field_2 + 8));
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                         (&stack0xffffffffffffffc0);
      FormatString<char[19],std::__cxx11::string,char[13]>
                ((string *)local_2b0,(Diligent *)"Unexpected EOF in ",
                 (char (*) [19])&pHVar4->Literal,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x474511,
                 (char (*) [13])Args);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_2d0,this,Token,4);
      End = (ObjectsTypeHashType *)0x57d;
      Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x57d,Args,(char (*) [2])0x46b1a3,&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)local_2b0);
    }
    if ((ImgFormat.field_2._12_4_ == 0x120) || (ImgFormat.field_2._12_4_ == 0x121)) {
      pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
      bVar2 = std::operator==(&pHVar4->Literal,",");
      if (bVar2) {
        std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
        err_7.field_2._8_8_ =
             std::__cxx11::
             list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
             ::end(&this->m_Tokens);
        bVar2 = std::operator!=(Token,(_Self *)((long)&err_7.field_2 + 8));
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             (&stack0xffffffffffffffc0);
          FormatString<char[19],std::__cxx11::string,char[13]>
                    ((string *)local_2f8,(Diligent *)"Unexpected EOF in ",
                     (char (*) [19])&pHVar4->Literal,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x474511,
                     (char (*) [13])Args);
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    ((String *)((long)&err_8.field_2 + 8),this,Token,4);
          End = (ObjectsTypeHashType *)0x587;
          Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessTextureDeclaration",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x587,Args,(char (*) [2])0x46b1a3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&err_8.field_2 + 8));
          std::__cxx11::string::~string((string *)(err_8.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_2f8);
        }
        pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
        if ((pHVar4->Type != NumericConstant) &&
           (pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token),
           pHVar4->Type != Identifier)) {
          pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             (&stack0xffffffffffffffc0);
          FormatString<char[34],std::__cxx11::string,char[13]>
                    ((string *)local_338,(Diligent *)"Number of samples is expected in ",
                     (char (*) [34])&pHVar4->Literal,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x474511,
                     (char (*) [13])Args);
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_358,this,Token,4);
          End = (ObjectsTypeHashType *)0x58d;
          Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessTextureDeclaration",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x58d,Args,(char (*) [2])0x46b1a3,&local_358);
          std::__cxx11::string::~string((string *)&local_358);
          std::__cxx11::string::~string((string *)local_338);
        }
        std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
        err_9.field_2._8_8_ =
             std::__cxx11::
             list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
             ::end(&this->m_Tokens);
        bVar2 = std::operator!=(Token,(_Self *)((long)&err_9.field_2 + 8));
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                             (&stack0xffffffffffffffc0);
          FormatString<char[19],std::__cxx11::string,char[13]>
                    ((string *)local_380,(Diligent *)"Unexpected EOF in ",
                     (char (*) [19])&pHVar4->Literal,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x474511,
                     (char (*) [13])Args);
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    ((String *)((long)&err_10.field_2 + 8),this,Token,4);
          End = (ObjectsTypeHashType *)0x591;
          Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessTextureDeclaration",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x591,Args,(char (*) [2])0x46b1a3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&err_10.field_2 + 8));
          std::__cxx11::string::~string((string *)(err_10.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_380);
        }
      }
    }
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    bVar2 = std::operator==(&pHVar4->Literal,">");
    if (!bVar2) {
      pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                         (&stack0xffffffffffffffc0);
      FormatString<char[16],std::__cxx11::string,char[13]>
                ((string *)local_3c0,(Diligent *)"Missing \">\" in ",(char (*) [16])&pHVar4->Literal
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x474511,
                 (char (*) [13])Args);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                ((String *)((long)&msg_1.field_2 + 8),this,Token,4);
      End = (ObjectsTypeHashType *)0x595;
      Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x595,Args,(char (*) [2])0x46b1a3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&msg_1.field_2 + 8));
      std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_3c0);
    }
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    if (pHVar4->Type != ComparisonOp) {
      FormatString<char[26],char[39]>
                ((string *)local_400,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Token->Type == TokenType::ComparisonOp",(char (*) [39])End);
      pCVar7 = (Char *)std::__cxx11::string::c_str();
      End = (ObjectsTypeHashType *)0x597;
      DebugAssertionFailed
                (pCVar7,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x597);
      std::__cxx11::string::~string((string *)local_400);
    }
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    pHVar4->Type = ClosingAngleBracket;
    if ((ImgFormat.field_2._M_local_buf[0xb] & 1U) != 0) {
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
      local_428 = std::__cxx11::string::begin();
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
      local_430._M_current = (char *)std::__cxx11::string::end();
      Parsing::
      ExtractGLSLImageFormatFromComment<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (&local_420,(Parsing *)&local_428,&local_430,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)End);
      std::__cxx11::string::operator=((string *)local_68,(string *)&local_420);
      std::__cxx11::string::~string((string *)&local_420);
      lVar5 = std::__cxx11::string::length();
      if (lVar5 == 0) {
        this_00 = (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)((long)&err_3.field_2 + 8);
        std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(this_00);
        local_458 = std::__cxx11::string::begin();
        std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(this_00);
        local_460._M_current = (char *)std::__cxx11::string::end();
        Parsing::
        ExtractGLSLImageFormatFromComment<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  (&local_450,(Parsing *)&local_458,&local_460,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)End);
        std::__cxx11::string::operator=((string *)local_68,(string *)&local_450);
        std::__cxx11::string::~string((string *)&local_450);
      }
      lVar5 = std::__cxx11::string::length();
      if (lVar5 != 0) {
        std::__cxx11::stringstream::stringstream(local_5e8);
        poVar6 = std::operator<<(local_5d8,"layout(");
        poVar6 = std::operator<<(poVar6,(string *)local_68);
        poVar6 = std::operator<<(poVar6,", binding=");
        uVar1 = *(uint *)&(TexDeclToken._M_node)->_M_next;
        *(uint *)&(TexDeclToken._M_node)->_M_next = uVar1 + 1;
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar1);
        std::operator<<(poVar6,")");
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator=(local_108,local_608);
        std::__cxx11::string::~string(local_608);
        std::__cxx11::stringstream::~stringstream(local_5e8);
      }
    }
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
    err_11.field_2._8_8_ =
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         end(&this->m_Tokens);
    bVar2 = std::operator!=(Token,(_Self *)((long)&err_11.field_2 + 8));
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                         (&stack0xffffffffffffffc0);
      FormatString<char[19],std::__cxx11::string,char[13]>
                ((string *)local_630,(Diligent *)"Unexpected EOF in ",
                 (char (*) [19])&pHVar4->Literal,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x474511,
                 (char (*) [13])Args);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                ((String *)((long)&msg_2.field_2 + 8),this,Token,4);
      Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_630;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x5b2,Args,(char (*) [2])0x46b1a3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&msg_2.field_2 + 8));
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_630);
    }
  }
  if ((ImgFormat.field_2._M_local_buf[0xb] & 1U) == 0) {
    std::__cxx11::string::append(LayoutQualifier.field_2._M_local_buf + 8);
  }
  else {
    std::__cxx11::string::append(LayoutQualifier.field_2._M_local_buf + 8);
  }
  switch(ImgFormat.field_2._12_4_) {
  case 0xcf:
  case 0x103:
    std::__cxx11::string::operator+=((string *)(LayoutQualifier.field_2._M_local_buf + 8),"Buffer");
    break;
  default:
    FormatString<char[24]>((string *)local_670,(char (*) [24])"Unexpected texture type");
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"ProcessTextureDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x5d4);
    std::__cxx11::string::~string((string *)local_670);
    break;
  case 0x106:
  case 0x11c:
    std::__cxx11::string::operator+=((string *)(LayoutQualifier.field_2._M_local_buf + 8),"1D");
    break;
  case 0x107:
  case 0x11d:
    std::__cxx11::string::operator+=((string *)(LayoutQualifier.field_2._M_local_buf + 8),"1DArray")
    ;
    break;
  case 0x108:
  case 0x11e:
    std::__cxx11::string::operator+=((string *)(LayoutQualifier.field_2._M_local_buf + 8),"2D");
    break;
  case 0x109:
  case 0x11f:
    std::__cxx11::string::operator+=((string *)(LayoutQualifier.field_2._M_local_buf + 8),"2DArray")
    ;
    break;
  case 0x10a:
  case 0x122:
    std::__cxx11::string::operator+=((string *)(LayoutQualifier.field_2._M_local_buf + 8),"3D");
    break;
  case 0x120:
    std::__cxx11::string::operator+=((string *)(LayoutQualifier.field_2._M_local_buf + 8),"2DMS");
    break;
  case 0x121:
    std::__cxx11::string::operator+=
              ((string *)(LayoutQualifier.field_2._M_local_buf + 8),"2DMSArray");
    break;
  case 0x123:
    std::__cxx11::string::operator+=((string *)(LayoutQualifier.field_2._M_local_buf + 8),"Cube");
    break;
  case 0x124:
    std::__cxx11::string::operator+=
              ((string *)(LayoutQualifier.field_2._M_local_buf + 8),"CubeArray");
  }
  std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
            (&local_678,(iterator *)((long)&GLSLSampler.field_2 + 8));
  std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
            (&local_680,Token);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::erase
            (&this->m_Tokens,local_678,local_680);
  sVar8 = std::
          vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
          ::size(Samplers);
  err_12.field_2._M_local_buf[0xf] = sVar8 == 1;
  do {
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    if (pHVar4->Type != Identifier) {
      pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                         (&stack0xffffffffffffffc0);
      FormatString<char[24],std::__cxx11::string,char[13]>
                ((string *)local_6b0,(Diligent *)"Identifier expected in ",
                 (char (*) [24])&pHVar4->Literal,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x474511,
                 (char (*) [13])Args);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                ((String *)&TextureName,this,Token,4);
      Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b0;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessTextureDeclaration",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x5e8,Args,(char (*) [2])0x46b1a3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&TextureName);
      std::__cxx11::string::~string((string *)&TextureName);
      std::__cxx11::string::~string((string *)local_6b0);
    }
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    bVar2 = std::operator==(&pHVar4->Delimiter,"");
    if (bVar2) {
      pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
      std::__cxx11::string::operator=((string *)&pHVar4->Delimiter," ");
    }
    pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    TmpToken._M_node._4_4_ = 0;
    local_6e8._M_node = Token->_M_node;
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_6e8);
    while( true ) {
      local_6f0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ::end(&this->m_Tokens);
      bVar3 = std::operator!=(&local_6e8,&local_6f0);
      bVar2 = false;
      if (bVar3) {
        pHVar11 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_6e8);
        bVar2 = pHVar11->Type == OpenSquareBracket;
      }
      if (!bVar2) break;
      local_700._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ::begin(&this->m_Tokens);
      local_708._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ::end(&this->m_Tokens);
      local_6f8 = (_List_node_base *)
                  Parsing::
                  FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                            (&local_700,&local_708,local_6e8);
      local_6e8 = (_List_iterator<Diligent::Parsing::HLSLTokenInfo>)local_6f8;
      err_13.field_2._8_8_ =
           std::__cxx11::
           list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ::end(&this->m_Tokens);
      bVar2 = std::operator!=(&local_6e8,(_Self *)((long)&err_13.field_2 + 8));
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        FormatString<char[48]>
                  ((string *)local_738,
                   (char (*) [48])"Unable to find matching closing square bracket.");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  ((String *)((long)&CompleteGLSLSampler.field_2 + 8),this,&local_6e8,4);
        Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_738;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessTextureDeclaration",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x5ff,Args,(char (*) [2])0x46b1a3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&CompleteGLSLSampler.field_2 + 8));
        std::__cxx11::string::~string((string *)(CompleteGLSLSampler.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_738);
      }
      TmpToken._M_node._4_4_ = TmpToken._M_node._4_4_ + 1;
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_6e8);
    }
    std::__cxx11::string::string
              ((string *)(SamplerName.field_2._M_local_buf + 8),
               (string *)(LayoutQualifier.field_2._M_local_buf + 8));
    if ((ImgFormat.field_2._M_local_buf[0xb] & 1U) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ScopeIt,
                     &pHVar4->Literal,SamplerSuffix);
      std::
      vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
      ::rbegin((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
                *)local_7a0);
      while( true ) {
        std::
        vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
        ::rend((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
                *)&SamplerIt);
        bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_*,_std::vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>_>_>
                                 *)local_7a0,
                                (reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_*,_std::vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>_>_>
                                 *)&SamplerIt);
        if (!bVar2) break;
        puVar9 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_*,_std::vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_*,_std::vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>_>_>
                               *)local_7a0);
        local_7b0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::find(puVar9,(key_type *)&ScopeIt);
        puVar9 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_*,_std::vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_*,_std::vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>_>_>
                               *)local_7a0);
        local_7b8._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::end(puVar9);
        bVar2 = std::__detail::operator!=(&local_7b0,&local_7b8);
        if (bVar2) {
          pvVar10 = std::__detail::
                    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_false,_true>
                    ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_false,_true>
                                  *)&local_7b0);
          if ((pvVar10->second & 1U) != 0) {
            std::__cxx11::string::append(SamplerName.field_2._M_local_buf + 8);
          }
          break;
        }
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_*,_std::vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_*,_std::vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>_>_>
                      *)local_7a0);
      }
      std::__cxx11::string::~string((string *)&ScopeIt);
    }
    pHVar11 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                        (&stack0xffffffffffffffc0);
    std::__cxx11::string::operator=((string *)&pHVar11->Literal,"");
    if ((err_12.field_2._M_local_buf[0xf] & 1U) != 0) {
      pHVar11 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                          (&stack0xffffffffffffffc0);
      std::__cxx11::string::append((string *)&pHVar11->Literal);
      pHVar11 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                          (&stack0xffffffffffffffc0);
      std::__cxx11::string::append((char *)&pHVar11->Literal);
      if (((((ImgFormat.field_2._M_local_buf[0xb] & 1U) != 0) &&
           (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_68,"r32f"), bVar2)) &&
          (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_68,"r32i"), bVar2)) &&
         (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_68,"r32ui"), bVar2)) {
        pHVar11 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                            (&stack0xffffffffffffffc0);
        std::__cxx11::string::append((char *)&pHVar11->Literal);
      }
    }
    pHVar11 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->
                        (&stack0xffffffffffffffc0);
    std::__cxx11::string::append((string *)&pHVar11->Literal);
    HashMapStringKey::HashMapStringKey(&local_800,&pHVar4->Literal,true);
    HLSLObjectInfo::HLSLObjectInfo
              (&local_828,(String *)((long)&SamplerName.field_2 + 8),msg.field_2._12_4_,
               TmpToken._M_node._4_4_);
    std::make_pair<Diligent::HashMapStringKey,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>
              (&local_7f0,&local_800,&local_828);
    _Var12 = std::
             unordered_map<Diligent::HashMapStringKey,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>>>
             ::
             insert<std::pair<Diligent::HashMapStringKey,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>>
                       ((unordered_map<Diligent::HashMapStringKey,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>>>
                         *)Objects,&local_7f0);
    local_838._M_cur =
         (__node_type *)
         _Var12.first.
         super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>,_false>
         ._M_cur;
    local_830 = _Var12.second;
    std::pair<Diligent::HashMapStringKey,_Diligent::HLSL2GLSLConverterImpl::HLSLObjectInfo>::~pair
              (&local_7f0);
    HLSLObjectInfo::~HLSLObjectInfo(&local_828);
    HashMapStringKey::~HashMapStringKey(&local_800);
    if ((err_12.field_2._M_local_buf[0xf] & 1U) == 0) {
LAB_00297cc2:
      local_918 = 0;
    }
    else {
      while( true ) {
        local_840._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
             ::end(&this->m_Tokens);
        bVar3 = std::operator!=(Token,&local_840);
        bVar2 = false;
        if (bVar3) {
          pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
          bVar2 = false;
          if (pHVar4->Type != Comma) {
            pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
            bVar2 = pHVar4->Type != Semicolon;
          }
        }
        if (!bVar2) break;
        pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
        bVar2 = std::operator==(&pHVar4->Literal,":");
        if (bVar2) {
          while( true ) {
            CurrToken = std::__cxx11::
                        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                        ::end(&this->m_Tokens);
            bVar3 = std::operator!=(Token,&CurrToken);
            bVar2 = false;
            if (bVar3) {
              pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
              bVar2 = false;
              if (pHVar4->Type != Comma) {
                pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
                bVar2 = pHVar4->Type != Semicolon;
              }
            }
            if (!bVar2) break;
            local_850._M_node = Token->_M_node;
            std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
            std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                      (&local_858,&local_850);
            local_860 = (_List_node_base *)
                        std::__cxx11::
                        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                        ::erase(&this->m_Tokens,local_858);
          }
        }
        else {
          std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
        }
      }
      local_868._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ::end(&this->m_Tokens);
      bVar2 = std::operator!=(Token,&local_868);
      if (!bVar2) goto LAB_00297cc2;
      pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
      if (pHVar4->Type == Comma) {
        pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
        pHVar4->Type = Semicolon;
        pHVar4 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
        std::__cxx11::string::operator=((string *)&pHVar4->Literal,";");
        std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
        std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
                  (&local_878,Token);
        _Type = ImgFormat.field_2._12_4_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_8e8,"",&local_8e9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_910,"\n",&local_911);
        Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0xffffffffffffffff;
        Parsing::HLSLTokenInfo::HLSLTokenInfo
                  (&local_8c8,_Type,&local_8e8,&local_910,0xffffffffffffffff);
        local_870 = (_List_node_base *)
                    std::__cxx11::
                    list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                    ::insert(&this->m_Tokens,local_878,&local_8c8);
        iStack_40 = (iterator)local_870;
        Parsing::HLSLTokenInfo::~HLSLTokenInfo(&local_8c8);
        std::__cxx11::string::~string((string *)&local_910);
        std::allocator<char>::~allocator((allocator<char> *)&local_911);
        std::__cxx11::string::~string((string *)&local_8e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
        goto LAB_00297cc2;
      }
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
      local_918 = 0x3d;
    }
    std::__cxx11::string::~string((string *)(SamplerName.field_2._M_local_buf + 8));
    if (local_918 != 0) break;
    local_a71 = false;
    if ((err_12.field_2._M_local_buf[0xf] & 1U) != 0) {
      local_920._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ::end(&this->m_Tokens);
      local_a71 = std::operator!=(Token,&local_920);
    }
  } while (local_a71 != false);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string((string *)(LayoutQualifier.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessTextureDeclaration(TokenListType::iterator&            Token,
                                                                         const std::vector<SamplerHashType>& Samplers,
                                                                         ObjectsTypeHashType&                Objects,
                                                                         const char*                         SamplerSuffix,
                                                                         Uint32&                             ImageBinding)
{
    auto TexDeclToken = Token;
    auto TextureDim   = TexDeclToken->Type;
    // Texture2D < float > ... ;
    // ^
    bool IsRWTexture =
        TextureDim == TokenType::kw_RWTexture1D ||
        TextureDim == TokenType::kw_RWTexture1DArray ||
        TextureDim == TokenType::kw_RWTexture2D ||
        TextureDim == TokenType::kw_RWTexture2DArray ||
        TextureDim == TokenType::kw_RWTexture3D ||
        TextureDim == TokenType::kw_RWBuffer;
    String ImgFormat;

    ++Token;
    // Texture2D < float > ... ;
    //           ^
#define CHECK_EOF() VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF in ", TexDeclToken->Literal, " declaration")
    CHECK_EOF();

    auto   TypeDefinitionStart = Token;
    String GLSLSampler;
    String LayoutQualifier;
    Uint32 NumComponents = 0;
    if (Token->Literal == "<")
    {
        // Fix token type
        VERIFY_EXPR(Token->Type == TokenType::ComparisonOp);
        Token->Type = TokenType::OpenAngleBracket;

        ++Token;
        CHECK_EOF();

        if (Token->Type == TokenType::kw_unorm)
        {
            // RWTexture2D < unorm float4 > ... ;
            //               ^
            ++Token;
            CHECK_EOF();
        }

        // Texture2D < float > ... ;
        //             ^
        auto TexFmtToken = Token;
        VERIFY_PARSER_STATE(Token, Token->IsBuiltInType(), "Texture format type must be built-in type");
        if (Token->Type >= TokenType::kw_float && Token->Type <= TokenType::kw_float4)
        {
            if (Token->Type == TokenType::kw_float)
                NumComponents = 1;
            else
                NumComponents = static_cast<int>(Token->Type) - static_cast<int>(TokenType::kw_float);
        }
        else if (Token->Type >= TokenType::kw_int && Token->Type <= TokenType::kw_int4)
        {
            GLSLSampler.push_back('i');
            if (Token->Type == TokenType::kw_int)
                NumComponents = 1;
            else
                NumComponents = static_cast<int>(Token->Type) - static_cast<int>(TokenType::kw_int);
        }
        else if (Token->Type >= TokenType::kw_uint && Token->Type <= TokenType::kw_uint4)
        {
            GLSLSampler.push_back('u');
            if (Token->Type == TokenType::kw_uint)
                NumComponents = 1;
            else
                NumComponents = static_cast<int>(Token->Type) - static_cast<int>(TokenType::kw_uint);
        }
        else
        {
            VERIFY_PARSER_STATE(Token, false, Token->Literal, " is not valid texture component type\n"
                                                              "Only the following texture element types are supported: float[1,2,3,4], int[1,2,3,4], uint[1,2,3,4]");
        }
        VERIFY_PARSER_STATE(Token, NumComponents >= 1 && NumComponents <= 4, "Between 1 and 4 components expected, ", NumComponents, " deduced");

        ++Token;
        CHECK_EOF();
        // Texture2D < float > ... ;
        //                   ^
        if ((TextureDim == TokenType::kw_Texture2DMS ||
             TextureDim == TokenType::kw_Texture2DMSArray) &&
            Token->Literal == ",")
        {
            // Texture2DMS < float, 4 > ... ;
            //                    ^
            ++Token;
            CHECK_EOF();
            // Texture2DMS < float, 4 > ... ;
            //                      ^
            // Texture2DMS < float, SAMPLE_COUNT > ... ;
            //                      ^
            VERIFY_PARSER_STATE(Token, Token->Type == TokenType::NumericConstant || Token->Type == TokenType::Identifier,
                                "Number of samples is expected in ", TexDeclToken->Literal, " declaration");

            // We do not really need the number of samples, so just skip it
            ++Token;
            CHECK_EOF();
            // Texture2DMS < float, 4 > ... ;
            //                        ^
        }
        VERIFY_PARSER_STATE(Token, Token->Literal == ">", "Missing \">\" in ", TexDeclToken->Literal, " declaration");
        // Fix token type
        VERIFY_EXPR(Token->Type == TokenType::ComparisonOp);
        Token->Type = TokenType::ClosingAngleBracket;

        if (IsRWTexture)
        {
            // RWTexture2D<float /* format = r32f */ >
            //                                       ^
            ImgFormat = Parsing::ExtractGLSLImageFormatFromComment(Token->Delimiter.begin(), Token->Delimiter.end());
            if (ImgFormat.length() == 0)
            {
                // RWTexture2D</* format = r32f */ float >
                //                                 ^
                //                            TexFmtToken
                ImgFormat = Parsing::ExtractGLSLImageFormatFromComment(TexFmtToken->Delimiter.begin(), TexFmtToken->Delimiter.end());
            }

            if (ImgFormat.length() != 0)
            {
                std::stringstream ss;
                ss << "layout(" << ImgFormat << ", binding=" << ImageBinding++ << ")";
                LayoutQualifier = ss.str();
            }
        }

        ++Token;
        // Texture2D < float > TexName ;
        //                     ^
        CHECK_EOF();
    }

    if (IsRWTexture)
        GLSLSampler.append("image");
    else
        GLSLSampler.append("sampler");

    switch (TextureDim)
    {
        // clang-format off
        case TokenType::kw_RWTexture1D:
        case TokenType::kw_Texture1D:          GLSLSampler += "1D";        break;

        case TokenType::kw_RWTexture1DArray:
        case TokenType::kw_Texture1DArray:     GLSLSampler += "1DArray";   break;

        case TokenType::kw_RWTexture2D:
        case TokenType::kw_Texture2D:          GLSLSampler += "2D";        break;

        case TokenType::kw_RWTexture2DArray:
        case TokenType::kw_Texture2DArray:     GLSLSampler += "2DArray";   break;

        case TokenType::kw_RWTexture3D:
        case TokenType::kw_Texture3D:          GLSLSampler += "3D";        break;

        case TokenType::kw_TextureCube:        GLSLSampler += "Cube";      break;
        case TokenType::kw_TextureCubeArray:   GLSLSampler += "CubeArray"; break;
        case TokenType::kw_Texture2DMS:        GLSLSampler += "2DMS";      break;
        case TokenType::kw_Texture2DMSArray:   GLSLSampler += "2DMSArray"; break;

        case TokenType::kw_RWBuffer:
        case TokenType::kw_Buffer:             GLSLSampler += "Buffer";    break;
        // clang-format on
        default: UNEXPECTED("Unexpected texture type");
    }

    //   TypeDefinitionStart
    //           |
    // Texture2D < float > TexName ;
    //                     ^
    m_Tokens.erase(TypeDefinitionStart, Token);
    // Texture2D TexName ;
    //           ^

    bool IsGlobalScope = Samplers.size() == 1;

    // There may be more than one texture variable declared in the same
    // statement:
    // Texture2D<float> g_Tex2D1, g_Tex2D1;
    do
    {
        // Texture2D TexName ;
        //           ^
        VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Identifier expected in ", TexDeclToken->Literal, " declaration");

        // Make sure there is a delimiter between sampler keyword and the
        // identifier. In cases like this
        // Texture2D<float>Name;
        // There will be no whitespace
        if (Token->Delimiter == "")
            Token->Delimiter = " ";

        // Texture2D TexName ;
        //           ^
        const auto& TextureName = Token->Literal;

        // Determine resource array dimensionality
        Uint32 ArrayDim = 0;
        {
            auto TmpToken = Token;
            ++TmpToken;
            while (TmpToken != m_Tokens.end() && TmpToken->Type == TokenType::OpenSquareBracket)
            {
                // Texture2D TexName[...][...]
                //                  ^
                TmpToken = Parsing::FindMatchingBracket(m_Tokens.begin(), m_Tokens.end(), TmpToken);
                VERIFY_PARSER_STATE(TmpToken, TmpToken != m_Tokens.end(), "Unable to find matching closing square bracket.");

                // Texture2D TexName[...][...]
                //                      ^

                ++ArrayDim;

                ++TmpToken;
                // Texture2D TexName[...][...]
                //                       ^
            }
        }

        auto CompleteGLSLSampler = GLSLSampler;
        if (!IsRWTexture)
        {
            // Try to find matching sampler
            auto SamplerName = TextureName + SamplerSuffix;
            // Search all scopes starting with the innermost
            for (auto ScopeIt = Samplers.rbegin(); ScopeIt != Samplers.rend(); ++ScopeIt)
            {
                auto SamplerIt = ScopeIt->find(SamplerName);
                if (SamplerIt != ScopeIt->end())
                {
                    if (SamplerIt->second)
                        CompleteGLSLSampler.append("Shadow");
                    break;
                }
            }
        }

        // TexDeclToken
        // |
        // Texture2D TexName ;
        //           ^
        TexDeclToken->Literal = "";
        if (IsGlobalScope)
        {
            // Use layout qualifier for global variables only, not for function arguments
            TexDeclToken->Literal.append(LayoutQualifier);
            // Samplers and images in global scope must be declared uniform.
            // Function arguments must not be declared uniform
            TexDeclToken->Literal.append("uniform ");
            // From GLES 3.1 spec:
            //    Except for image variables qualified with the format qualifiers r32f, r32i, and r32ui,
            //    image variables must specify either memory qualifier readonly or the memory qualifier writeonly.
            // So on GLES we have to assume that an image is a writeonly variable
            if (IsRWTexture && ImgFormat != "r32f" && ImgFormat != "r32i" && ImgFormat != "r32ui")
                TexDeclToken->Literal.append("IMAGE_WRITEONLY "); // defined as 'writeonly' on GLES and as '' on desktop in GLSLDefinitions.h
        }
        TexDeclToken->Literal.append(CompleteGLSLSampler);
        Objects.m.insert(std::make_pair(HashMapStringKey(TextureName), HLSLObjectInfo{std::move(CompleteGLSLSampler), NumComponents, ArrayDim}));

        // In global scope, multiple variables can be declared in the same statement
        if (IsGlobalScope)
        {
            // Texture2D TexName, TexName2 ;
            //           ^

            // Go to the next texture in the declaration or to the statement end, removing register declarations
            while (Token != m_Tokens.end() && Token->Type != TokenType::Comma && Token->Type != TokenType::Semicolon)
            {
                if (Token->Literal == ":")
                {
                    // Texture2D TexName : register(t0);
                    // Texture2D TexName : register(t0),
                    //                   ^

                    // Remove register
                    while (Token != m_Tokens.end() && Token->Type != TokenType::Comma && Token->Type != TokenType::Semicolon)
                    {
                        auto CurrToken = Token;
                        ++Token;
                        m_Tokens.erase(CurrToken);
                    }

                    // Texture2D TexName ,
                    //                   ^
                }
                else
                {
                    ++Token;
                }
            }

            if (Token != m_Tokens.end())
            {
                if (Token->Type == TokenType::Comma)
                {
                    // Texture2D TexName, TexName2 ;
                    //                  ^
                    Token->Type    = TokenType::Semicolon;
                    Token->Literal = ";";
                    // Texture2D TexName; TexName2 ;
                    //                  ^

                    ++Token;
                    // Texture2D TexName; TexName2 ;
                    //                    ^

                    // Insert empty token that will contain next sampler/image declaration
                    TexDeclToken = m_Tokens.insert(Token, TokenInfo(TextureDim, "", "\n"));
                    // Texture2D TexName;
                    // <Texture Declaration TBD> TexName2 ;
                    // ^                         ^
                    // TexDeclToken              Token
                }
                else
                {
                    // Texture2D TexName, TexName2 ;
                    //                             ^
                    ++Token;
                    break;
                }
            }
        }
    } while (IsGlobalScope && Token != m_Tokens.end());

#undef SKIP_DELIMITER
#undef CHECK_EOF
}